

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

void __thiscall
rapidjson::internal::BigInteger::AppendDecimal64(BigInteger *this,char *begin,char *end)

{
  bool bVar1;
  uint exp_00;
  uint64_t u_00;
  BigInteger *pBVar2;
  uint exp;
  uint64_t u;
  char *end_local;
  char *begin_local;
  BigInteger *this_local;
  
  u_00 = ParseUint64(begin,end);
  bVar1 = IsZero(this);
  if (bVar1) {
    operator=(this,u_00);
  }
  else {
    exp_00 = (int)end - (int)begin;
    pBVar2 = MultiplyPow5(this,exp_00);
    pBVar2 = operator<<=(pBVar2,(ulong)exp_00);
    operator+=(pBVar2,u_00);
  }
  return;
}

Assistant:

void AppendDecimal64(const char* begin, const char* end) {
        uint64_t u = ParseUint64(begin, end);
        if (IsZero())
            *this = u;
        else {
            unsigned exp = static_cast<unsigned>(end - begin);
            (MultiplyPow5(exp) <<= exp) += u;   // *this = *this * 10^exp + u
        }
    }